

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

uint ImGui::RoundScalarWithFormatT<unsigned_int,int>(char *format,ImGuiDataType data_type,uint v)

{
  uint in_EDX;
  int in_ESI;
  char *in_RDI;
  double dVar1;
  char *p;
  char v_str [64];
  char *fmt_start;
  char *local_70;
  char local_68 [72];
  char *local_20;
  uint local_18;
  int local_14;
  uint local_4;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_20 = ImParseFormatFindStart(in_RDI);
  if ((*local_20 == '%') && (local_20[1] != '%')) {
    ImFormatString(local_68,0x40,local_20,(ulong)local_18);
    for (local_70 = local_68; *local_70 == ' '; local_70 = local_70 + 1) {
    }
    if ((local_14 == 4) || (local_14 == 5)) {
      dVar1 = ImAtof((char *)0x1a349e);
      local_18 = (uint)(long)dVar1;
    }
    else {
      ImAtoi<int>(local_70,(int *)&local_18);
    }
    local_4 = local_18;
  }
  else {
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}